

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O3

int CVBBDPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                  void *bbd_data)

{
  CVodeMem cv_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *msgfmt;
  long lVar21;
  long j;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  long local_98;
  double local_90;
  long local_88;
  
  cv_mem = *(CVodeMem *)((long)bbd_data + 0x98);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar7 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x38));
    if (iVar7 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar7 = 0x1f7;
      goto LAB_001115d1;
    }
    if (iVar7 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bbd_data + 0x50);
    uVar2 = *(undefined8 *)((long)bbd_data + 0x58);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x60);
    lVar4 = *(long *)((long)bbd_data + 0x98);
    local_90 = 1.0;
    N_VScale(y,uVar2);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar7 = (**(code **)((long)bbd_data + 0x30))
                          (t,*(undefined8 *)((long)bbd_data + 0x78),y,*(undefined8 *)(lVar4 + 0x18))
       , iVar7 == 0)) {
      iVar7 = (**(code **)((long)bbd_data + 0x28))
                        (t,*(undefined8 *)((long)bbd_data + 0x78),uVar2,uVar1,
                         *(undefined8 *)(lVar4 + 0x18));
      *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
      if (iVar7 == 0) {
        lVar8 = N_VGetArrayPointer(y);
        lVar9 = N_VGetArrayPointer(uVar1);
        lVar10 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 200));
        lVar11 = N_VGetArrayPointer(uVar2);
        lVar12 = N_VGetArrayPointer(uVar3);
        if (*(int *)(lVar4 + 0x58) == 0) {
          local_98 = 0;
        }
        else {
          local_98 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 0x108));
        }
        dVar23 = (double)N_VWrmsNorm(uVar1,*(undefined8 *)(lVar4 + 200));
        lVar20 = *(long *)((long)bbd_data + 0x78);
        if ((dVar23 != 0.0) || (NAN(dVar23))) {
          local_90 = dVar23 * (double)lVar20 *
                              ABS(*(double *)(lVar4 + 0x140)) * 1000.0 * *(double *)(lVar4 + 8);
        }
        lVar5 = *bbd_data;
        lVar6 = *(long *)((long)bbd_data + 8);
        lVar21 = lVar6 + lVar5 + 1;
        lVar18 = lVar20;
        if (lVar21 < lVar20) {
          lVar18 = lVar21;
        }
        if (0 < lVar18) {
          local_88 = 0;
          lVar13 = 1;
          do {
            j = lVar13 + -1;
            if (lVar13 <= lVar20) {
              iVar7 = *(int *)(lVar4 + 0x58);
              lVar15 = j;
              do {
                dVar23 = *(double *)(lVar8 + lVar15 * 8);
                dVar24 = ABS(dVar23) * *(double *)((long)bbd_data + 0x20);
                dVar25 = local_90 / *(double *)(lVar10 + lVar15 * 8);
                if (dVar24 <= dVar25) {
                  dVar24 = dVar25;
                }
                if (iVar7 != 0) {
                  dVar25 = *(double *)(local_98 + lVar15 * 8);
                  dVar26 = ABS(dVar25);
                  if ((dVar26 != 1.0) || (NAN(dVar26))) {
                    if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0))))
                    goto LAB_001117c0;
                  }
                  else if ((dVar23 + dVar24) * dVar25 < 0.0) {
LAB_001117c0:
                    dVar24 = -dVar24;
                  }
                }
                *(double *)(lVar11 + lVar15 * 8) = dVar24 + *(double *)(lVar11 + lVar15 * 8);
                lVar15 = lVar15 + lVar21;
              } while (lVar15 < lVar20);
            }
            iVar7 = (**(code **)((long)bbd_data + 0x28))
                              (t,lVar20,uVar2,uVar3,*(undefined8 *)(lVar4 + 0x18));
            *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
            if (iVar7 != 0) goto LAB_00111550;
            lVar20 = *(long *)((long)bbd_data + 0x78);
            lVar15 = local_88;
            if (lVar13 <= lVar20) {
              do {
                dVar23 = *(double *)(lVar8 + j * 8);
                *(double *)(lVar11 + j * 8) = dVar23;
                psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x38),j);
                dVar24 = ABS(*(double *)(lVar8 + j * 8)) * *(double *)((long)bbd_data + 0x20);
                dVar25 = local_90 / *(double *)(lVar10 + j * 8);
                if (dVar24 <= dVar25) {
                  dVar24 = dVar25;
                }
                if (*(int *)(lVar4 + 0x58) != 0) {
                  dVar25 = *(double *)(local_98 + j * 8);
                  dVar26 = ABS(dVar25);
                  if ((dVar26 != 1.0) || (NAN(dVar26))) {
                    if ((dVar26 == 2.0) && ((!NAN(dVar26) && ((dVar23 + dVar24) * dVar25 <= 0.0))))
                    goto LAB_001118f6;
                  }
                  else if ((dVar23 + dVar24) * dVar25 < 0.0) {
LAB_001118f6:
                    dVar24 = -dVar24;
                  }
                }
                lVar16 = j - *(long *)((long)bbd_data + 0x10);
                lVar19 = 0;
                if (0 < lVar16) {
                  lVar19 = lVar16;
                }
                lVar20 = *(long *)((long)bbd_data + 0x78);
                lVar17 = *(long *)((long)bbd_data + 0x18) + j;
                if (lVar20 + -1 <= lVar17) {
                  lVar17 = lVar20 + -1;
                }
                if (lVar19 <= lVar17) {
                  if (lVar16 < 1) {
                    lVar16 = 0;
                  }
                  lVar16 = lVar16 + -1;
                  do {
                    *(double *)((long)psVar14 + lVar16 * 8 + lVar15 + 8) =
                         (*(double *)(lVar12 + 8 + lVar16 * 8) - *(double *)(lVar9 + 8 + lVar16 * 8)
                         ) * (1.0 / dVar24);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < lVar17);
                }
                j = j + lVar21;
                lVar15 = lVar15 + ~(lVar6 + lVar5) * 8;
              } while (j < lVar20);
            }
            local_88 = local_88 + -8;
            bVar22 = lVar13 != lVar18;
            lVar13 = lVar13 + 1;
          } while (bVar22);
        }
        iVar7 = SUNMatCopy(*(undefined8 *)((long)bbd_data + 0x38),
                           *(undefined8 *)((long)bbd_data + 0x40));
        if (iVar7 < 0) {
          msgfmt = "An error arose from a SUNBandMatrix routine.";
          iVar7 = 0x209;
          goto LAB_001115d1;
        }
        goto LAB_00111434;
      }
    }
LAB_00111550:
    if (-1 < iVar7) {
      return 1;
    }
    msgfmt = "The gloc or cfn routine failed in an unrecoverable manner.";
    iVar7 = 0x200;
  }
  else {
    *jcurPtr = 0;
    iVar7 = SUNMatCopy(*(undefined8 *)((long)bbd_data + 0x38),*(undefined8 *)((long)bbd_data + 0x40)
                      );
    if (iVar7 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar7 = 0x1e9;
      goto LAB_001115d1;
    }
LAB_00111434:
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bbd_data + 0x40));
    if (iVar7 == 0) {
      iVar7 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                  *(SUNMatrix *)((long)bbd_data + 0x40));
      return iVar7;
    }
    msgfmt = "An error arose from a SUNBandMatrix routine.";
    iVar7 = 0x214;
  }
LAB_001115d1:
  cvProcessError(cv_mem,-1,iVar7,"CVBBDPrecSetup",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBBDPrecSetup(sunrealtype t, N_Vector y,
                          SUNDIALS_MAYBE_UNUSED N_Vector fy, sunbooleantype jok,
                          sunbooleantype* jcurPtr, sunrealtype gamma,
                          void* bbd_data)
{
  CVBBDPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  pdata  = (CVBBDPrecData)bbd_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  /* If jok = SUNTRUE, use saved copy of J */
  if (jok)
  {
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    /* Otherwise call CVBBDDQJac for new J value */
  }
  else
  {
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBBDDQJac(pdata, t, y, pdata->tmp1, pdata->tmp2, pdata->tmp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_FUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add I to get P = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}